

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * rbuMainToWal(char *zName,int flags)

{
  size_t sVar1;
  int local_24;
  char *pcStack_20;
  int odd;
  char *z;
  int n;
  int flags_local;
  char *zName_local;
  
  sVar1 = strlen(zName);
  pcStack_20 = zName + (int)sVar1;
  if ((flags & 0x40U) == 0) {
    for (; *pcStack_20 == '\0'; pcStack_20 = pcStack_20 + 1) {
    }
  }
  else {
    local_24 = 0;
    for (; ((*pcStack_20 != '\0' || (local_24 = 1 - local_24, local_24 == 0)) ||
           (pcStack_20[1] != '\0')); pcStack_20 = pcStack_20 + 1) {
    }
    pcStack_20 = pcStack_20 + 2;
  }
  return pcStack_20 + ((int)sVar1 + 9);
}

Assistant:

static const char *rbuMainToWal(const char *zName, int flags){
  int n = (int)strlen(zName);
  const char *z = &zName[n];
  if( flags & SQLITE_OPEN_URI ){
    int odd = 0;
    while( 1 ){
      if( z[0]==0 ){
        odd = 1 - odd;
        if( odd && z[1]==0 ) break;
      }
      z++;
    }
    z += 2;
  }else{
    while( *z==0 ) z++;
  }
  z += (n + 8 + 1);
  return z;
}